

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O0

void __thiscall Assimp::Q3BSPFileParser::countLumps(Q3BSPFileParser *this)

{
  Q3BSPModel *pQVar1;
  reference ppsVar2;
  Q3BSPFileParser *this_local;
  
  pQVar1 = this->m_pModel;
  ppsVar2 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>::
            operator[](&this->m_pModel->m_Lumps,10);
  std::vector<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>::resize
            (&pQVar1->m_Vertices,(ulong)(long)(*ppsVar2)->iSize / 0x2c);
  pQVar1 = this->m_pModel;
  ppsVar2 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>::
            operator[](&this->m_pModel->m_Lumps,0xb);
  std::vector<int,_std::allocator<int>_>::resize
            (&pQVar1->m_Indices,(ulong)(long)(*ppsVar2)->iSize >> 2);
  pQVar1 = this->m_pModel;
  ppsVar2 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>::
            operator[](&this->m_pModel->m_Lumps,0xd);
  std::vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>::resize
            (&pQVar1->m_Faces,(ulong)(long)(*ppsVar2)->iSize / 0x68);
  pQVar1 = this->m_pModel;
  ppsVar2 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>::
            operator[](&this->m_pModel->m_Lumps,1);
  std::vector<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>::
  resize(&pQVar1->m_Textures,(ulong)(long)(*ppsVar2)->iSize / 0x48);
  pQVar1 = this->m_pModel;
  ppsVar2 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>::
            operator[](&this->m_pModel->m_Lumps,0xe);
  std::vector<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>::
  resize(&pQVar1->m_Lightmaps,(ulong)(long)(*ppsVar2)->iSize / 0xc000);
  return;
}

Assistant:

void Q3BSPFileParser::countLumps()
{
    m_pModel->m_Vertices.resize( m_pModel->m_Lumps[ kVertices ]->iSize / sizeof( sQ3BSPVertex ) );
    m_pModel->m_Indices.resize( m_pModel->m_Lumps[ kMeshVerts ]->iSize  / sizeof( int ) );
    m_pModel->m_Faces.resize( m_pModel->m_Lumps[ kFaces ]->iSize / sizeof( sQ3BSPFace ) );
    m_pModel->m_Textures.resize( m_pModel->m_Lumps[ kTextures ]->iSize / sizeof( sQ3BSPTexture ) );
    m_pModel->m_Lightmaps.resize( m_pModel->m_Lumps[ kLightmaps ]->iSize / sizeof( sQ3BSPLightmap ) );
}